

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_connective.c
# Opt level: O1

void x_connective_setup(void)

{
  _class *p_Var1;
  undefined8 in_RAX;
  t_symbol *ptVar2;
  uint uVar4;
  ulong uVar3;
  
  uVar4 = (uint)((ulong)in_RAX >> 0x20);
  pdint_setup();
  pdfloat_setup();
  pdsymbol_setup();
  bang_setup();
  ptVar2 = gensym("send");
  uVar3 = (ulong)uVar4 << 0x20;
  send_class = class_new(ptVar2,send_new,(t_method)0x0,0x38,0,A_DEFSYM,uVar3);
  ptVar2 = gensym("s");
  class_addcreator(send_new,ptVar2,A_DEFSYM,0);
  class_addbang(send_class,send_bang);
  class_doaddfloat(send_class,send_float);
  class_addsymbol(send_class,send_symbol);
  class_addpointer(send_class,send_pointer);
  class_addlist(send_class,send_list);
  class_addanything(send_class,send_anything);
  p_Var1 = send_class;
  ptVar2 = gensym("send-receive");
  class_sethelpsymbol(p_Var1,ptVar2);
  ptVar2 = gensym("receive");
  uVar3 = uVar3 & 0xffffffff00000000;
  receive_class = class_new(ptVar2,receive_new,receive_free,0x38,8,A_DEFSYM,uVar3);
  ptVar2 = gensym("r");
  class_addcreator(receive_new,ptVar2,A_DEFSYM,0);
  class_addbang(receive_class,receive_bang);
  class_doaddfloat(receive_class,receive_float);
  class_addsymbol(receive_class,receive_symbol);
  class_addpointer(receive_class,receive_pointer);
  class_addlist(receive_class,receive_list);
  class_addanything(receive_class,receive_anything);
  p_Var1 = receive_class;
  ptVar2 = gensym("send-receive");
  class_sethelpsymbol(p_Var1,ptVar2);
  select_setup();
  route_setup();
  ptVar2 = gensym("pack");
  uVar3 = uVar3 & 0xffffffff00000000;
  pack_class = class_new(ptVar2,pack_new,pack_free,0x58,0,A_GIMME,uVar3);
  class_addbang(pack_class,pack_bang);
  class_addpointer(pack_class,pack_pointer);
  class_doaddfloat(pack_class,pack_float);
  class_addsymbol(pack_class,pack_symbol);
  class_addlist(pack_class,pack_list);
  class_addanything(pack_class,pack_anything);
  ptVar2 = gensym("unpack");
  uVar3 = uVar3 & 0xffffffff00000000;
  unpack_class = class_new(ptVar2,unpack_new,unpack_free,0x40,0,A_GIMME,uVar3);
  class_addlist(unpack_class,unpack_list);
  class_addanything(unpack_class,unpack_anything);
  ptVar2 = gensym("trigger");
  uVar3 = uVar3 & 0xffffffff00000000;
  trigger_class = class_new(ptVar2,trigger_new,trigger_free,0x40,0,A_GIMME,uVar3);
  ptVar2 = gensym("t");
  class_addcreator(trigger_new,ptVar2,A_GIMME,0);
  class_addlist(trigger_class,trigger_list);
  class_addbang(trigger_class,trigger_bang);
  class_addpointer(trigger_class,trigger_pointer);
  class_doaddfloat(trigger_class,trigger_float);
  class_addsymbol(trigger_class,trigger_symbol);
  class_addanything(trigger_class,trigger_anything);
  ptVar2 = gensym("spigot");
  uVar3 = uVar3 & 0xffffffff00000000;
  spigot_class = class_new(ptVar2,spigot_new,(t_method)0x0,0x38,0,A_DEFFLOAT,uVar3);
  class_addbang(spigot_class,spigot_bang);
  class_addpointer(spigot_class,spigot_pointer);
  class_doaddfloat(spigot_class,spigot_float);
  class_addsymbol(spigot_class,spigot_symbol);
  class_addlist(spigot_class,spigot_list);
  class_addanything(spigot_class,spigot_anything);
  ptVar2 = gensym("moses");
  uVar3 = uVar3 & 0xffffffff00000000;
  moses_class = class_new(ptVar2,moses_new,(t_method)0x0,0x40,0,A_DEFFLOAT,uVar3);
  class_doaddfloat(moses_class,moses_float);
  ptVar2 = gensym("until");
  until_class = class_new(ptVar2,until_new,(t_method)0x0,0x38,0,A_NULL);
  class_addbang(until_class,until_bang);
  class_doaddfloat(until_class,until_float);
  p_Var1 = until_class;
  ptVar2 = gensym("bang2");
  class_addmethod(p_Var1,until_bang2,ptVar2,A_NULL);
  ptVar2 = gensym("makefilename");
  uVar3 = uVar3 & 0xffffffff00000000;
  makefilename_class = class_new(ptVar2,makefilename_new,(t_method)0x0,0x40,0,A_DEFSYM,uVar3);
  class_doaddfloat(makefilename_class,makefilename_float);
  class_addsymbol(makefilename_class,makefilename_symbol);
  class_addbang(makefilename_class,makefilename_bang);
  p_Var1 = makefilename_class;
  ptVar2 = gensym("set");
  class_addmethod(p_Var1,makefilename_set,ptVar2,A_SYMBOL);
  swap_setup();
  change_setup();
  ptVar2 = gensym("value");
  value_class = class_new(ptVar2,value_new,value_ff,0x40,0,A_DEFSYM,uVar3 & 0xffffffff00000000);
  ptVar2 = gensym("v");
  class_addcreator(value_new,ptVar2,A_DEFSYM,0);
  class_addbang(value_class,value_bang);
  class_doaddfloat(value_class,value_float);
  p_Var1 = value_class;
  ptVar2 = gensym("symbol2");
  class_addmethod(p_Var1,value_symbol2,ptVar2,A_DEFSYM,0);
  p_Var1 = value_class;
  ptVar2 = gensym("send");
  class_addmethod(p_Var1,value_send,ptVar2,A_SYMBOL,0);
  ptVar2 = gensym("value");
  vcommon_class = class_new(ptVar2,(t_newmethod)0x0,(t_method)0x0,0x10,1,A_NULL);
  class_doaddfloat(vcommon_class,vcommon_float);
  return;
}

Assistant:

void x_connective_setup(void)
{
    pdint_setup();
    pdfloat_setup();
    pdsymbol_setup();
    bang_setup();
    send_setup();
    receive_setup();
    select_setup();
    route_setup();
    pack_setup();
    unpack_setup();
    trigger_setup();
    spigot_setup();
    moses_setup();
    until_setup();
    makefilename_setup();
    swap_setup();
    change_setup();
    value_setup();
}